

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderingAttachmentLocationInfoKHR *info,ScratchAllocator *alloc)

{
  VkRenderingAttachmentLocationInfo *pVVar1;
  uint *puVar2;
  
  pVVar1 = copy<VkRenderingAttachmentLocationInfo>(this,info,1,alloc);
  if (pVVar1->pColorAttachmentLocations != (uint *)0x0) {
    puVar2 = copy<unsigned_int>(this,pVVar1->pColorAttachmentLocations,
                                (ulong)info->colorAttachmentCount,alloc);
    pVVar1->pColorAttachmentLocations = puVar2;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkRenderingAttachmentLocationInfoKHR *info, ScratchAllocator &alloc)
{
	auto *loc_info = copy(info, 1, alloc);
	if (loc_info->pColorAttachmentLocations)
		loc_info->pColorAttachmentLocations = copy(loc_info->pColorAttachmentLocations, info->colorAttachmentCount, alloc);
	return loc_info;
}